

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_stdlib.cpp
# Opt level: O1

bool ImGui::InputTextWithHint
               (char *label,char *hint,string *str,ImGuiInputTextFlags flags,
               ImGuiInputTextCallback callback,void *user_data)

{
  char *buf;
  bool bVar1;
  size_t buf_size;
  InputTextCallback_UserData cb_user_data;
  string *local_18;
  ImGuiInputTextCallback local_10;
  void *local_8;
  
  buf = (str->_M_dataplus)._M_p;
  buf_size = 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buf != &str->field_2) {
    buf_size = (str->field_2)._M_allocated_capacity + 1;
  }
  local_18 = str;
  local_10 = callback;
  local_8 = user_data;
  bVar1 = InputTextWithHint(label,hint,buf,buf_size,flags | 0x40000,InputTextCallback,&local_18);
  return bVar1;
}

Assistant:

bool ImGui::InputTextWithHint(const char* label, const char* hint, std::string* str, ImGuiInputTextFlags flags, ImGuiInputTextCallback callback, void* user_data)
{
    IM_ASSERT((flags & ImGuiInputTextFlags_CallbackResize) == 0);
    flags |= ImGuiInputTextFlags_CallbackResize;

    InputTextCallback_UserData cb_user_data;
    cb_user_data.Str = str;
    cb_user_data.ChainCallback = callback;
    cb_user_data.ChainCallbackUserData = user_data;
    return InputTextWithHint(label, hint, (char*)str->c_str(), str->capacity() + 1, flags, InputTextCallback, &cb_user_data);
}